

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

PClassActor * __thiscall ADehackedPickup::DetermineType(ADehackedPickup *this)

{
  int iVar1;
  spritedef_t *__s2;
  PClassActor *pPVar2;
  int iVar3;
  int lex;
  int mid;
  int max;
  int min;
  ADehackedPickup *this_local;
  
  mid = 0;
  lex = 0x23;
  while( true ) {
    if (lex < mid) {
      return (PClassActor *)0x0;
    }
    iVar3 = (mid + lex) / 2;
    __s2 = TArray<spritedef_t,_spritedef_t>::operator[]
                     (&sprites,(long)(this->super_AInventory).super_AActor.sprite);
    iVar1 = memcmp(DehSpriteMappings + iVar3,__s2,4);
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      mid = iVar3 + 1;
    }
    else {
      lex = iVar3 + -1;
    }
  }
  pPVar2 = PClass::FindActor(DehSpriteMappings[iVar3].ClassName);
  return pPVar2;
}

Assistant:

PClassActor *ADehackedPickup::DetermineType ()
{
	// Look at the actor's current sprite to determine what kind of
	// item to pretend to me.
	int min = 0;
	int max = countof(DehSpriteMappings) - 1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lex = memcmp (DehSpriteMappings[mid].Sprite, sprites[sprite].name, 4);
		if (lex == 0)
		{
			return PClass::FindActor(DehSpriteMappings[mid].ClassName);
		}
		else if (lex < 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}